

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O3

void __thiscall RootIndexProxyModel::~RootIndexProxyModel(RootIndexProxyModel *this)

{
  Data *pDVar1;
  RootIndexProxyModelPrivate *this_00;
  Connection *pCVar2;
  
  *(undefined ***)this = &PTR_metaObject_00166410;
  this_00 = this->m_dptr;
  if ((this_00->m_sourceConnections).d.size != 0) {
    pCVar2 = (this_00->m_sourceConnections).d.ptr;
    do {
      QObject::disconnect(pCVar2);
      pCVar2 = pCVar2 + 1;
    } while (pCVar2 != (this_00->m_sourceConnections).d.ptr + (this_00->m_sourceConnections).d.size)
    ;
    this_00 = this->m_dptr;
    if (this_00 == (RootIndexProxyModelPrivate *)0x0) {
      this_00 = (RootIndexProxyModelPrivate *)0x0;
      goto LAB_0013c633;
    }
  }
  pDVar1 = (this_00->proxyIndexes).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_00->proxyIndexes).d.d)->super_QArrayData,0x18,8);
    }
  }
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
            (&(this_00->layoutChangePersistentIndexes).d);
  QPersistentModelIndex::~QPersistentModelIndex(&this_00->m_rootIndex);
  QArrayDataPointer<QMetaObject::Connection>::~QArrayDataPointer
            ((QArrayDataPointer<QMetaObject::Connection> *)this_00);
LAB_0013c633:
  operator_delete(this_00,0x60);
  QIdentityProxyModel::~QIdentityProxyModel(&this->super_QIdentityProxyModel);
  return;
}

Assistant:

RootIndexProxyModel::~RootIndexProxyModel()
{
    Q_D(RootIndexProxyModel);
    for (auto discIter = d->m_sourceConnections.cbegin(); discIter != d->m_sourceConnections.cend(); ++discIter)
        QObject::disconnect(*discIter);
    delete m_dptr;
}